

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

pair<int,_int> __thiscall
Lodtalk::InstanceVariableScope::findInstanceVariable
          (InstanceVariableScope *this,ClassDescription *pos,Oop symbol)

{
  ClassDescription *pos_00;
  bool bVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  size_t sVar3;
  void *pvVar4;
  pair<int,_int> pVar5;
  ulong local_68;
  size_t i;
  Oop *nameArray;
  size_t count;
  anon_union_8_4_0eb573b0_for_Oop_0 aStack_48;
  int instanceVarIndex;
  Oop instanceVarNames;
  Behavior *super;
  ClassDescription *pCStack_28;
  int instanceCount;
  ClassDescription *pos_local;
  InstanceVariableScope *this_local;
  Oop symbol_local;
  pair<int,_int> superInstance;
  
  super._4_4_ = 0;
  pos_00 = (ClassDescription *)(pos->super_Behavior).superclass;
  pCStack_28 = pos;
  pos_local = (ClassDescription *)this;
  this_local = (InstanceVariableScope *)symbol.field_0;
  bVar1 = isNil((ProtoObject *)pos_00);
  if (!bVar1) {
    instanceVarNames.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)this_local;
    aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)findInstanceVariable(this,pos_00,(Oop)this_local);
    symbol_local.field_0.uintValue._0_4_ = (undefined4)aVar2.uintValue;
    if (-1 < (int)symbol_local.field_0.intValue._0_4_) {
      return (pair<int,_int>)aVar2.pointer;
    }
    symbol_local.field_0.uintValue._4_4_ = (undefined4)((ulong)aVar2 >> 0x20);
    super._4_4_ = symbol_local.field_0.uintValue._4_4_;
    symbol_local.field_0 = aVar2;
  }
  aStack_48 = (pCStack_28->instanceVariables).field_0;
  count._4_4_ = -1;
  bVar1 = Oop::isNil((Oop *)&stack0xffffffffffffffb8);
  if (!bVar1) {
    sVar3 = Oop::getNumberOfElements((Oop *)&stack0xffffffffffffffb8);
    pvVar4 = Oop::getFirstFieldPointer((Oop *)&stack0xffffffffffffffb8);
    for (local_68 = 0; local_68 < sVar3; local_68 = local_68 + 1) {
      bVar1 = Oop::operator==((Oop *)((long)pvVar4 + local_68 * 8),(Oop *)&this_local);
      if (bVar1) {
        count._4_4_ = (int)local_68 + super._4_4_;
        break;
      }
    }
    super._4_4_ = (int)sVar3 + super._4_4_;
  }
  pVar5 = std::make_pair<int&,int&>((int *)((long)&count + 4),(int *)((long)&super + 4));
  return pVar5;
}

Assistant:

std::pair<int, int> InstanceVariableScope::findInstanceVariable(ClassDescription *pos, Oop symbol)
{
	// Find the superclass first
	auto instanceCount = 0;
	auto super = pos->superclass;
	if(!isNil(super))
	{
		auto superInstance = findInstanceVariable(reinterpret_cast<ClassDescription*> (super), symbol);
		if(superInstance.first >= 0)
			return superInstance;
		instanceCount = superInstance.second;
	}

	// Find the symbol here
	auto instanceVarNames = pos->instanceVariables;
	auto instanceVarIndex = -1;
	if(!instanceVarNames.isNil())
	{
		size_t count = instanceVarNames.getNumberOfElements();
		auto nameArray = reinterpret_cast<Oop*> (instanceVarNames.getFirstFieldPointer());
		for(size_t i = 0; i < count; ++i)
		{
			if(nameArray[i] == symbol)
			{
				instanceVarIndex = (int)i + instanceCount;
				break;
			}
		}
		instanceCount += (int)count;
	}

	return std::make_pair(instanceVarIndex, instanceCount);
}